

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_outbound_item.c
# Opt level: O3

void nghttp2_outbound_item_free(nghttp2_outbound_item *item,nghttp2_mem *mem)

{
  uint8_t uVar1;
  undefined8 *puVar2;
  size_t sVar3;
  
  if (item == (nghttp2_outbound_item *)0x0) {
    return;
  }
  uVar1 = (item->frame).hd.type;
  switch(uVar1) {
  case '\0':
    nghttp2_frame_data_free((nghttp2_data *)item);
    return;
  case '\x01':
    nghttp2_frame_headers_free((nghttp2_headers *)item,mem);
    return;
  case '\x02':
    nghttp2_frame_priority_free((nghttp2_priority *)item);
    return;
  case '\x03':
    nghttp2_frame_rst_stream_free((nghttp2_rst_stream *)item);
    return;
  case '\x04':
    nghttp2_frame_settings_free((nghttp2_settings *)item,mem);
    return;
  case '\x05':
    nghttp2_frame_push_promise_free((nghttp2_push_promise *)item,mem);
    return;
  case '\x06':
    nghttp2_frame_ping_free((nghttp2_ping *)item);
    return;
  case '\a':
    nghttp2_frame_goaway_free((nghttp2_goaway *)item,mem);
    return;
  case '\b':
    nghttp2_frame_window_update_free((nghttp2_window_update *)item);
    return;
  }
  if ((item->aux_data).goaway.flags == '\0') {
    return;
  }
  if (uVar1 == '\x10') {
    sVar3 = (item->frame).data.padlen;
    if (sVar3 == 0) {
      return;
    }
    nghttp2_mem_free(mem,*(void **)(sVar3 + 8));
    return;
  }
  if (uVar1 == '\f') {
    sVar3 = (item->frame).data.padlen;
    if (sVar3 == 0) {
      return;
    }
    nghttp2_mem_free(mem,*(void **)(sVar3 + 8));
    return;
  }
  if (uVar1 == '\n') {
    puVar2 = (undefined8 *)(item->frame).ext.payload;
    if (puVar2 == (undefined8 *)0x0) {
      return;
    }
    nghttp2_mem_free(mem,(void *)*puVar2);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_outbound_item.c"
                ,0x60,"void nghttp2_outbound_item_free(nghttp2_outbound_item *, nghttp2_mem *)");
}

Assistant:

void nghttp2_outbound_item_free(nghttp2_outbound_item *item, nghttp2_mem *mem) {
  nghttp2_frame *frame;

  if (item == NULL) {
    return;
  }

  frame = &item->frame;

  switch (frame->hd.type) {
  case NGHTTP2_DATA:
    nghttp2_frame_data_free(&frame->data);
    break;
  case NGHTTP2_HEADERS:
    nghttp2_frame_headers_free(&frame->headers, mem);
    break;
  case NGHTTP2_PRIORITY:
    nghttp2_frame_priority_free(&frame->priority);
    break;
  case NGHTTP2_RST_STREAM:
    nghttp2_frame_rst_stream_free(&frame->rst_stream);
    break;
  case NGHTTP2_SETTINGS:
    nghttp2_frame_settings_free(&frame->settings, mem);
    break;
  case NGHTTP2_PUSH_PROMISE:
    nghttp2_frame_push_promise_free(&frame->push_promise, mem);
    break;
  case NGHTTP2_PING:
    nghttp2_frame_ping_free(&frame->ping);
    break;
  case NGHTTP2_GOAWAY:
    nghttp2_frame_goaway_free(&frame->goaway, mem);
    break;
  case NGHTTP2_WINDOW_UPDATE:
    nghttp2_frame_window_update_free(&frame->window_update);
    break;
  default: {
    nghttp2_ext_aux_data *aux_data;

    aux_data = &item->aux_data.ext;

    if (aux_data->builtin == 0) {
      nghttp2_frame_extension_free(&frame->ext);
      break;
    }

    switch (frame->hd.type) {
    case NGHTTP2_ALTSVC:
      nghttp2_frame_altsvc_free(&frame->ext, mem);
      break;
    case NGHTTP2_ORIGIN:
      nghttp2_frame_origin_free(&frame->ext, mem);
      break;
    case NGHTTP2_PRIORITY_UPDATE:
      nghttp2_frame_priority_update_free(&frame->ext, mem);
      break;
    default:
      assert(0);
      break;
    }
  }
  }
}